

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

char * next_option(char *list,vec *val,vec *eq_val)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  
  if (val == (vec *)0x0) {
LAB_001269a4:
    list = (char *)0x0;
  }
  else {
    do {
      if ((list == (char *)0x0) || (pcVar5 = list, *list == '\0')) goto LAB_001269a4;
      for (; (*pcVar5 == ' ' || (*pcVar5 == '\t')); pcVar5 = pcVar5 + 1) {
        list = list + 1;
      }
      val->ptr = pcVar5;
      pcVar2 = strchr(pcVar5,0x2c);
      if (pcVar2 == (char *)0x0) {
        sVar3 = strlen(pcVar5);
        list = pcVar5 + sVar3;
        val->len = sVar3;
      }
      else {
        val->len = (long)pcVar2 - (long)list;
        list = pcVar2 + 1;
      }
      uVar4 = val->len;
      if (0 < (int)(uint)uVar4) {
        uVar4 = (ulong)((uint)uVar4 & 0x7fffffff);
        do {
          if ((pcVar5[uVar4 - 1] != ' ') && (pcVar5[uVar4 - 1] != '\t')) goto LAB_0012694a;
          bVar1 = 1 < (long)uVar4;
          uVar4 = uVar4 - 1;
        } while (bVar1);
        uVar4 = 0;
      }
LAB_0012694a:
      val->len = (long)(int)uVar4;
    } while ((int)uVar4 == 0);
    if (eq_val != (vec *)0x0) {
      eq_val->len = 0;
      sVar3 = val->len;
      pcVar5 = (char *)memchr(pcVar5,0x3d,sVar3);
      eq_val->ptr = pcVar5;
      if (pcVar5 != (char *)0x0) {
        eq_val->ptr = pcVar5 + 1;
        pcVar2 = val->ptr;
        eq_val->len = (size_t)(pcVar2 + (sVar3 - (long)(pcVar5 + 1)));
        val->len = (size_t)(pcVar5 + ~(ulong)pcVar2 + 1);
      }
    }
  }
  return list;
}

Assistant:

static const char *
next_option(const char *list, struct vec *val, struct vec *eq_val)
{
	int end;

reparse:
	if (val == NULL || list == NULL || *list == '\0') {
		/* End of the list */
		return NULL;
	}

	/* Skip over leading LWS */
	while (*list == ' ' || *list == '\t')
		list++;

	val->ptr = list;
	if ((list = strchr(val->ptr, ',')) != NULL) {
		/* Comma found. Store length and shift the list ptr */
		val->len = ((size_t)(list - val->ptr));
		list++;
	} else {
		/* This value is the last one */
		list = val->ptr + strlen(val->ptr);
		val->len = ((size_t)(list - val->ptr));
	}

	/* Adjust length for trailing LWS */
	end = (int)val->len - 1;
	while (end >= 0 && ((val->ptr[end] == ' ') || (val->ptr[end] == '\t')))
		end--;
	val->len = (size_t)(end) + (size_t)(1);

	if (val->len == 0) {
		/* Ignore any empty entries. */
		goto reparse;
	}

	if (eq_val != NULL) {
		/* Value has form "x=y", adjust pointers and lengths
		 * so that val points to "x", and eq_val points to "y". */
		eq_val->len = 0;
		eq_val->ptr = (const char *)memchr(val->ptr, '=', val->len);
		if (eq_val->ptr != NULL) {
			eq_val->ptr++; /* Skip over '=' character */
			eq_val->len = ((size_t)(val->ptr - eq_val->ptr)) + val->len;
			val->len = ((size_t)(eq_val->ptr - val->ptr)) - 1;
		}
	}

	return list;
}